

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O2

entry_t_conflict * entry_prev(entry_t_conflict *entry)

{
  entry_t_conflict *peVar1;
  entry_t_conflict *peVar2;
  bool bVar3;
  
  peVar1 = entry->left;
  if (entry->left == (entry_t_conflict *)0x0) {
    do {
      peVar2 = entry->parent;
      if (peVar2 == (entry_t_conflict *)0x0) {
        return (entry_t_conflict *)0x0;
      }
      bVar3 = peVar2->left == entry;
      entry = peVar2;
    } while (bVar3);
  }
  else {
    do {
      peVar2 = peVar1;
      peVar1 = peVar2->right;
    } while (peVar2->right != (coll_tmap_entry_t *)0x0);
  }
  return peVar2;
}

Assistant:

static entry_t *entry_prev(entry_t *entry) {
    if (!entry) {
        return NULL;
    }
    if (entry->left) {
        entry = entry->left;
        while (entry->right) {
            entry = entry->right;
        }
        return entry;
    }
    entry_t *prev = entry;
    entry = entry->parent;
    while (entry && entry->left == prev) {
        prev = entry;
        entry = entry->parent;
    }
    return entry;
}